

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O0

int * init_filters(bcf_hdr_t *hdr,char *filters,int *nfilters)

{
  int iVar1;
  int *local_58;
  int *out;
  char *pcStack_48;
  int nout;
  char *prev;
  char *tmp;
  kstring_t str;
  int *nfilters_local;
  char *filters_local;
  bcf_hdr_t *hdr_local;
  
  str.s = (char *)nfilters;
  memset(&tmp,0,0x18);
  out._4_4_ = 0;
  local_58 = (int *)0x0;
  pcStack_48 = filters;
  prev = filters;
  do {
    if ((*prev == ',') || (*prev == '\0')) {
      local_58 = (int *)realloc(local_58,(long)(out._4_4_ + 1) << 2);
      if (((long)prev - (long)pcStack_48 == 1) && (*pcStack_48 == '.')) {
        local_58[out._4_4_] = -1;
      }
      else {
        tmp = (char *)0x0;
        kputsn(pcStack_48,(int)prev - (int)pcStack_48,(kstring_t *)&tmp);
        iVar1 = bcf_hdr_id2int(hdr,0,(char *)str.m);
        local_58[out._4_4_] = iVar1;
      }
      out._4_4_ = out._4_4_ + 1;
      if (*prev == '\0') {
        if (str.l != 0) {
          free((void *)str.m);
        }
        *(int *)str.s = out._4_4_;
        return local_58;
      }
      pcStack_48 = prev + 1;
    }
    prev = prev + 1;
  } while( true );
}

Assistant:

static int *init_filters(bcf_hdr_t *hdr, const char *filters, int *nfilters)
{
    kstring_t str = {0,0,0};
    const char *tmp = filters, *prev = filters;
    int nout = 0, *out = NULL;
    while ( 1 )
    {
        if ( *tmp==',' || !*tmp )
        {
            out = (int*) realloc(out, (nout+1)*sizeof(int));
            if ( tmp-prev==1 && *prev=='.' )
                out[nout] = -1;
            else
            {
                str.l = 0;
                kputsn(prev, tmp-prev, &str);
                out[nout] = bcf_hdr_id2int(hdr, BCF_DT_ID, str.s);
            }
            nout++;
            if ( !*tmp ) break;
            prev = tmp+1;
        }
        tmp++;
    }
    if ( str.m ) free(str.s);
    *nfilters = nout;
    return out;
}